

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O1

string * __thiscall
MemoryManager::dumpMemory_abi_cxx11_(string *__return_storage_ptr__,MemoryManager *this)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint32_t k;
  long lVar4;
  uint32_t j;
  long lVar5;
  int iVar6;
  uint32_t i;
  long lVar7;
  char buf [65536];
  char acStack_10038 [65544];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  iVar2 = 0;
  lVar7 = 0;
  do {
    if (this->memory[lVar7] != (uint8_t **)0x0) {
      uVar1 = (uint)(lVar7 << 0x16);
      sprintf(acStack_10038,"0x%x-0x%x:\n",lVar7 << 0x16 & 0xffffffff,(ulong)(uVar1 + 0x400000));
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      lVar5 = 0;
      iVar6 = iVar2;
      do {
        if (this->memory[lVar7][lVar5] != (uint8_t *)0x0) {
          uVar3 = (int)lVar5 * 0x1000;
          sprintf(acStack_10038,"  0x%x-0x%x\n",(ulong)(uVar1 | uVar3),
                  (ulong)(uVar3 + (uVar1 | 0x1000)));
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          lVar4 = 0;
          do {
            sprintf(acStack_10038,"    0x%x: 0x%x\n",(ulong)(uint)((int)lVar4 + iVar6),
                    (ulong)this->memory[lVar7][lVar5][lVar4]);
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            lVar4 = lVar4 + 1;
          } while (lVar4 != 0x400);
        }
        lVar5 = lVar5 + 1;
        iVar6 = iVar6 + 0x1000;
      } while (lVar5 != 0x400);
    }
    lVar7 = lVar7 + 1;
    iVar2 = iVar2 + 0x400000;
  } while (lVar7 != 0x400);
  return __return_storage_ptr__;
}

Assistant:

std::string MemoryManager::dumpMemory() {
  char buf[65536];
  std::string dump;

  dump += "Memory Pages: \n";
  for (uint32_t i = 0; i < 1024; ++i) {
    if (this->memory[i] == nullptr) {
      continue;
    }
    sprintf(buf, "0x%x-0x%x:\n", i << 22, (i + 1) << 22);
    dump += buf;
    for (uint32_t j = 0; j < 1024; ++j) {
      if (this->memory[i][j] == nullptr) {
        continue;
      }
      sprintf(buf, "  0x%x-0x%x\n", (i << 22) + (j << 12),
              (i << 22) + ((j + 1) << 12));
      dump += buf;

      for (uint32_t k = 0; k < 1024; ++k) {
        sprintf(buf, "    0x%x: 0x%x\n", (i << 22) + (j << 12) + k,
                this->memory[i][j][k]);
        dump += buf;
      }
    }
  }
  return dump;
}